

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::TimingControl::visit<slang::ast::SampledValueExprVisitor>
          (TimingControl *this,SampledValueExprVisitor *visitor)

{
  logic_error *this_00;
  string local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  SampledValueExprVisitor *local_18;
  SampledValueExprVisitor *visitor_local;
  TimingControl *this_local;
  
  local_18 = visitor;
  visitor_local = (SampledValueExprVisitor *)this;
  switch(this->kind) {
  case Invalid:
    SampledValueExprVisitor::visit<slang::ast::TimingControl>(visitor,this);
    break;
  case Delay:
    SampledValueExprVisitor::visit<slang::ast::DelayControl>(visitor,(DelayControl *)this);
    break;
  case SignalEvent:
    SampledValueExprVisitor::visit<slang::ast::SignalEventControl>
              (visitor,(SignalEventControl *)this);
    break;
  case EventList:
    SampledValueExprVisitor::visit<slang::ast::EventListControl>(visitor,(EventListControl *)this);
    break;
  case ImplicitEvent:
    SampledValueExprVisitor::visit<slang::ast::ImplicitEventControl>
              (visitor,(ImplicitEventControl *)this);
    break;
  case RepeatedEvent:
    SampledValueExprVisitor::visit<slang::ast::RepeatedEventControl>
              (visitor,(RepeatedEventControl *)this);
    break;
  case Delay3:
    SampledValueExprVisitor::visit<slang::ast::Delay3Control>(visitor,(Delay3Control *)this);
    break;
  case OneStepDelay:
    SampledValueExprVisitor::visit<slang::ast::OneStepDelayControl>
              (visitor,(OneStepDelayControl *)this);
    break;
  case CycleDelay:
    SampledValueExprVisitor::visit<slang::ast::CycleDelayControl>(visitor,(CycleDelayControl *)this)
    ;
    break;
  case BlockEventList:
    SampledValueExprVisitor::visit<slang::ast::BlockEventListControl>
              (visitor,(BlockEventListControl *)this);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_b9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_f0,0x123);
    std::operator+(&local_78,&local_98,&local_f0);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

decltype(auto) TimingControl::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case TimingControlKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case TimingControlKind::Invalid: return visitor.visit(*this, std::forward<Args>(args)...);
        CASE(Delay, DelayControl);
        CASE(Delay3, Delay3Control);
        CASE(SignalEvent, SignalEventControl);
        CASE(EventList, EventListControl);
        CASE(ImplicitEvent, ImplicitEventControl);
        CASE(RepeatedEvent, RepeatedEventControl);
        CASE(OneStepDelay, OneStepDelayControl);
        CASE(CycleDelay, CycleDelayControl);
        CASE(BlockEventList, BlockEventListControl);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}